

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O3

void __thiscall glslang::TQualifier::makeTemporary(TQualifier *this)

{
  this->semanticName = (char *)0x0;
  this->field_0x10 = this->field_0x10 & 0xf0;
  this->layoutOffset = -1;
  this->layoutAlign = -1;
  this->layoutPushConstant = false;
  this->layoutBufferReference = false;
  this->layoutPassthrough = false;
  this->layoutViewportRelative = false;
  this->layoutSecondaryViewportRelativeOffset = -0x800;
  this->layoutBindlessSampler = false;
  this->layoutBindlessImage = false;
  this->layoutShaderRecord = false;
  this->layoutFullQuads = false;
  this->layoutQuadDeriv = false;
  this->layoutHitObjectShaderRecordNV = false;
  this->spirvStorageClass = -1;
  this->field_0x2c = 0;
  *(ulong *)&this->field_0x1c =
       (ulong)(*(uint *)&this->field_0x1c & 0xffc00000) | 0xffffffff001fcfff;
  *(ulong *)&this->field_0x24 = *(ulong *)&this->field_0x24 | 0x1ffffff7fffffff;
  this->spirvDecorate = (TSpirvDecorate *)0x0;
  *(ulong *)&this->field_0x8 = *(ulong *)&this->field_0x8 & 0x141fff0000;
  return;
}

Assistant:

void makeTemporary()
    {
        semanticName = nullptr;
        storage = EvqTemporary;
        builtIn = EbvNone;
        clearInterstage();
        clearMemory();
        specConstant = false;
        nonUniform = false;
        nullInit = false;
        defaultBlock = false;
        clearLayout();
        spirvStorageClass = -1;
        spirvDecorate = nullptr;
        spirvByReference = false;
        spirvLiteral = false;
    }